

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O2

void __thiscall
Atari2600::TIA::draw_object_visible<Atari2600::TIA::Ball>
          (TIA *this,Ball *object,uint8_t collision_identity,int start,int end,int time_now)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int count;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar4 = (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.motion_time +
          -0x40;
  do {
    iVar8 = start;
    iVar5 = end;
    if (iVar4 < end) {
      iVar5 = iVar4;
    }
LAB_002cf3d4:
    if (end <= iVar8) {
      return;
    }
    iVar3 = end;
    if ((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving != false
       ) {
      iVar3 = iVar5;
    }
    uVar1 = (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position;
    uVar2 = object->copy_flags;
    iVar6 = 0xa0;
    if ((uVar2 != 0) && (iVar6 = 0x10, ((byte)uVar2 & (int)uVar1 < 0x10) == 0)) {
      if ((int)uVar1 < 0x20) {
        iVar6 = 0x20;
        if ((uVar2 & 2) == 0) {
LAB_002cf420:
          iVar6 = 0x40;
          if ((uVar2 & 4) == 0) {
            iVar6 = 0xa0;
          }
        }
      }
      else {
        iVar6 = 0xa0;
        if (uVar1 < 0x40) goto LAB_002cf420;
      }
    }
    iVar6 = (iVar6 + iVar8) - uVar1;
    start = iVar3;
    if (iVar6 < iVar3) {
      start = iVar6;
    }
    iVar7 = start - iVar8;
    count = iVar7;
    if ((((object->super_HorizontalRun).enqueues != true) || (start <= time_now)) ||
       (count = time_now - iVar8, count != 0 && iVar8 <= time_now)) {
      Ball::output_pixels(object,this->collision_buffer_ + iVar8,count,collision_identity,
                          iVar8 + 0x40);
    }
    (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position =
         (iVar7 + (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position
         ) % 0xa0;
    if (((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving != true
        ) || (start != iVar4)) {
      iVar8 = start;
      if (iVar6 <= iVar3) {
        (object->super_HorizontalRun).pixel_position = (object->super_HorizontalRun).size;
      }
      goto LAB_002cf3d4;
    }
    perform_motion_step<Atari2600::TIA::Ball>(this,object);
    iVar4 = iVar4 + 4;
  } while( true );
}

Assistant:

void TIA::draw_object_visible(T &object, const uint8_t collision_identity, int start, int end, int time_now) {
	// perform a miniature event loop on (i) triggering draws; (ii) drawing; and (iii) motion
	int next_motion_time = object.motion_time - first_pixel_cycle + 4;
	while(start < end) {
		int next_event_time = end;

		// is the next event a movement tick?
		if(object.is_moving && next_motion_time < next_event_time) {
			next_event_time = next_motion_time;
		}

		// is the next event a graphics trigger?
		int next_copy = 160;
		int next_copy_id = 0;
		if(object.copy_flags) {
			if(object.position < 16 && object.copy_flags&1) {
				next_copy = 16;
				next_copy_id = 1;
			} else if(object.position < 32 && object.copy_flags&2) {
				next_copy = 32;
				next_copy_id = 2;
			} else if(object.position < 64 && object.copy_flags&4) {
				next_copy = 64;
				next_copy_id = 3;
			}
		}

		int next_copy_time = start + next_copy - object.position;
		if(next_copy_time < next_event_time) next_event_time = next_copy_time;

		// the decision is to progress by length
		const int length = next_event_time - start;

		// enqueue a future intention to draw pixels if spitting them out now would violate accuracy;
		// otherwise draw them now
		if(object.enqueues && next_event_time > time_now) {
			if(start < time_now) {
				object.output_pixels(&collision_buffer_[start], time_now - start, collision_identity, start + first_pixel_cycle - 4);
				object.enqueue_pixels(time_now, next_event_time, time_now + first_pixel_cycle - 4);
			} else {
				object.enqueue_pixels(start, next_event_time, start + first_pixel_cycle - 4);
			}
		} else {
			object.output_pixels(&collision_buffer_[start], length, collision_identity, start + first_pixel_cycle - 4);
		}

		// the next interesting event is after next_event_time cycles, so progress
		object.position = (object.position + length) % 160;
		start = next_event_time;

		// if the event is a motion tick, apply; if it's a draw trigger, trigger a draw
		if(object.is_moving && start == next_motion_time) {
			perform_motion_step(object);
			next_motion_time += 4;
		} else if(start == next_copy_time) {
			object.reset_pixels(next_copy_id);
		}
	}
}